

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O2

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeRow(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,int n,
           LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *newRow,bool scale)

{
  Item *pIVar1;
  uint *puVar2;
  int iVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  int *piVar5;
  byte bVar6;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pLVar7;
  uint uVar8;
  undefined7 in_register_00000009;
  Item *pIVar9;
  ulong uVar10;
  long lVar11;
  int n_local;
  undefined4 local_f8;
  int idx;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  soplex local_a8 [8];
  uint auStack_a0 [2];
  uint local_98 [2];
  uint auStack_90 [2];
  uint local_88 [2];
  int local_80;
  undefined1 local_7c;
  fpclass_type local_78;
  int32_t local_74;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_68;
  
  if (-1 < n) {
    local_f8 = (undefined4)CONCAT71(in_register_00000009,scale);
    pIVar9 = (this->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.theitem;
    iVar3 = (this->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thekey[(uint)n].idx;
    pIVar1 = pIVar9 + iVar3;
    uVar10 = (ulong)(uint)pIVar9[iVar3].data.
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused;
    lVar11 = uVar10 * 0x3c + -4;
    n_local = n;
    local_f0 = newRow;
    for (; pLVar7 = local_f0, 0 < (int)uVar10; uVar10 = (ulong)((int)uVar10 - 1)) {
      pIVar9 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.theitem +
               (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey
               [*(int *)((long)(((pIVar1->data).
                                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .m_elem)->val).m_backend.data._M_elems + lVar11)].idx;
      uVar8 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)pIVar9,n);
      if (-1 < (int)uVar8) {
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)pIVar9,(char *)(ulong)uVar8);
      }
      lVar11 = lVar11 + -0x3c;
    }
    (pIVar1->data).
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .memused = 0;
    local_e8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((local_f0->left).m_backend.data._M_elems + 8);
    local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_f0->left).m_backend.data._M_elems
    ;
    local_e8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((local_f0->left).m_backend.data._M_elems + 2);
    local_e8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((local_f0->left).m_backend.data._M_elems + 4);
    local_e8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((local_f0->left).m_backend.data._M_elems + 6);
    local_e8.m_backend.exp = (local_f0->left).m_backend.exp;
    local_e8.m_backend.neg = (local_f0->left).m_backend.neg;
    local_e8.m_backend.fpclass = (local_f0->left).m_backend.fpclass;
    local_e8.m_backend.prec_elem = (local_f0->left).m_backend.prec_elem;
    bVar6 = (byte)local_f8;
    uVar10 = (ulong)(byte)local_f8;
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x33])(this,(ulong)(uint)n,&local_e8,uVar10);
    local_e8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((pLVar7->right).m_backend.data._M_elems + 8);
    local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pLVar7->right).m_backend.data._M_elems;
    local_e8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((pLVar7->right).m_backend.data._M_elems + 2);
    local_e8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((pLVar7->right).m_backend.data._M_elems + 4);
    local_e8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((pLVar7->right).m_backend.data._M_elems + 6);
    local_e8.m_backend.exp = (pLVar7->right).m_backend.exp;
    local_e8.m_backend.neg = (pLVar7->right).m_backend.neg;
    local_e8.m_backend.fpclass = (pLVar7->right).m_backend.fpclass;
    local_e8.m_backend.prec_elem = (pLVar7->right).m_backend.prec_elem;
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x36])(this,(ulong)(uint)n,&local_e8,(ulong)bVar6);
    local_e8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((pLVar7->object).m_backend.data._M_elems + 8);
    local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pLVar7->object).m_backend.data._M_elems
    ;
    local_e8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((pLVar7->object).m_backend.data._M_elems + 2);
    local_e8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((pLVar7->object).m_backend.data._M_elems + 4);
    local_e8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((pLVar7->object).m_backend.data._M_elems + 6);
    local_e8.m_backend.exp = (pLVar7->object).m_backend.exp;
    local_e8.m_backend.neg = (pLVar7->object).m_backend.neg;
    local_e8.m_backend.fpclass = (pLVar7->object).m_backend.fpclass;
    local_e8.m_backend.prec_elem = (pLVar7->object).m_backend.prec_elem;
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x3c])(this,(ulong)(uint)n,&local_e8,uVar10);
    uVar10 = (ulong)(uint)(pLVar7->vec).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused;
    lVar11 = uVar10 * 0x3c + -4;
    for (; 0 < (int)uVar10; uVar10 = (ulong)((int)uVar10 - 1)) {
      pNVar4 = (local_f0->vec).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      idx = *(int *)((long)(pNVar4->val).m_backend.data._M_elems + lVar11);
      local_e8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((long)(pNVar4->val).m_backend.data._M_elems + lVar11 + -0x18);
      puVar2 = (uint *)((long)(&pNVar4->val + -1) + lVar11);
      local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
      local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = (uint *)((long)(&(pNVar4->val).m_backend.data + -1) + lVar11);
      local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      local_e8.m_backend.exp =
           *(int *)((long)(pNVar4->val).m_backend.data._M_elems + lVar11 + -0x10);
      local_e8.m_backend.neg =
           *(bool *)((long)(pNVar4->val).m_backend.data._M_elems + lVar11 + -0xc);
      local_e8.m_backend.fpclass =
           *(fpclass_type *)((long)(pNVar4->val).m_backend.data._M_elems + lVar11 + -8);
      local_e8.m_backend.prec_elem =
           *(int32_t *)((long)(pNVar4->val).m_backend.data._M_elems + lVar11 + -4);
      if ((byte)local_f8 != '\0') {
        piVar5 = (this->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).scaleExp.data;
        local_a8 = (soplex  [8])local_e8.m_backend.data._M_elems._0_8_;
        auStack_a0 = (uint  [2])local_e8.m_backend.data._M_elems._8_8_;
        local_98 = (uint  [2])local_e8.m_backend.data._M_elems._16_8_;
        auStack_90 = (uint  [2])local_e8.m_backend.data._M_elems._24_8_;
        local_88 = (uint  [2])local_e8.m_backend.data._M_elems._32_8_;
        local_80 = local_e8.m_backend.exp;
        local_7c = local_e8.m_backend.neg;
        local_78 = local_e8.m_backend.fpclass;
        local_74 = local_e8.m_backend.prec_elem;
        spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                  (&local_68,local_a8,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)(ulong)(uint)((this->
                                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).scaleExp.data[idx] + piVar5[n_local]),(int)piVar5);
        local_e8.m_backend.data._M_elems[8] = local_68.m_backend.data._M_elems[8];
        local_e8.m_backend.data._M_elems[9] = local_68.m_backend.data._M_elems[9];
        local_e8.m_backend.data._M_elems[4] = local_68.m_backend.data._M_elems[4];
        local_e8.m_backend.data._M_elems[5] = local_68.m_backend.data._M_elems[5];
        local_e8.m_backend.data._M_elems[6] = local_68.m_backend.data._M_elems[6];
        local_e8.m_backend.data._M_elems[7] = local_68.m_backend.data._M_elems[7];
        local_e8.m_backend.data._M_elems[0] = local_68.m_backend.data._M_elems[0];
        local_e8.m_backend.data._M_elems[1] = local_68.m_backend.data._M_elems[1];
        local_e8.m_backend.data._M_elems[2] = local_68.m_backend.data._M_elems[2];
        local_e8.m_backend.data._M_elems[3] = local_68.m_backend.data._M_elems[3];
        local_e8.m_backend.exp = local_68.m_backend.exp;
        local_e8.m_backend.neg = local_68.m_backend.neg;
        local_e8.m_backend.fpclass = local_68.m_backend.fpclass;
        local_e8.m_backend.prec_elem = local_68.m_backend.prec_elem;
      }
      LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::add2(&this->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ,n_local,1,&idx,&local_e8);
      LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::add2(&this->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ,idx,1,&n_local,&local_e8);
      lVar11 = lVar11 + -0x3c;
    }
  }
  return;
}

Assistant:

virtual void changeRow(int n, const LPRowBase<R>& newRow, bool scale = false)
   {
      if(n < 0)
         return;

      int j;
      SVectorBase<R>& row = rowVector_w(n);

      for(j = row.size() - 1; j >= 0; --j)
      {
         SVectorBase<R>& col = colVector_w(row.index(j));
         int position = col.pos(n);

         assert(position != -1);

         if(position >= 0)
            col.remove(position);
      }

      row.clear();

      changeLhs(n, newRow.lhs(), scale);
      changeRhs(n, newRow.rhs(), scale);
      changeRowObj(n, newRow.obj(), scale);

      const SVectorBase<R>& newrow = newRow.rowVector();

      for(j = newrow.size() - 1; j >= 0; --j)
      {
         int idx = newrow.index(j);
         R val = newrow.value(j);

         if(scale)
            val = spxLdexp(val, LPRowSetBase<R>::scaleExp[n] + LPColSetBase<R>::scaleExp[idx]);

         LPRowSetBase<R>::add2(n, 1, &idx, &val);
         LPColSetBase<R>::add2(idx, 1, &n, &val);
      }

      assert(isConsistent());
   }